

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate.c
# Opt level: O1

void * dsGetIndex(void)

{
  ulong uVar1;
  void *pvVar2;
  void *pvVar3;
  
  pthread_once(&keyOnce,makeKey);
  pvVar2 = pthread_getspecific(key);
  if (pvVar2 == (void *)0x0) {
    dsRunLogCallback("%s(): Can\'t get active crate.\n","dsGetIndex");
  }
  else {
    uVar1 = *(ulong *)(*(long *)((long)pvVar2 + 0x30) + 0x10);
    if ((uVar1 < *(ulong *)((long)pvVar2 + 0x18)) ||
       (*(ulong *)((long)pvVar2 + 0x18) + *(long *)((long)pvVar2 + 0x20) <
        *(long *)(*(long *)((long)pvVar2 + 0x30) + 0x18) + uVar1)) {
      pvVar3 = (void *)0x0;
      dsRunLogCallback("%s(): Can\'t map region outside of crate.\n","mapObject");
    }
    else {
      pvVar3 = (void *)(uVar1 + *(long *)((long)pvVar2 + 0x10));
    }
    if (pvVar3 != (void *)0x0) {
      return pvVar3;
    }
    dsRunLogCallback("%s(): Can\'t mapObject(,%lu,%lu)\n","dsGetIndex",
                     *(undefined8 *)(*(long *)((long)pvVar2 + 0x30) + 0x10),
                     *(undefined8 *)(*(long *)((long)pvVar2 + 0x30) + 0x18));
  }
  return (void *)0xffffffffffffffff;
}

Assistant:

void *
dsGetIndex()
{
	dsCrate *crate = NULL;
	void *ptr;

	if ((crate = getActiveCrate()) == NULL) {
		dsLog("Can't get active crate.\n");
		return (void *)-1;
	}

	if ((ptr = mapObject(crate, crate->super->indexObjectOffset,
					crate->super->indexObjectLength)) == NULL) {
		dsLog("Can't mapObject(,%" PRIu64 ",%" PRIu64 ")\n",
			crate->super->indexObjectOffset,
			crate->super->indexObjectLength);
		return (void *)-1;
	}

	return ptr;
}